

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::openWriteFile
          (Highs *this,string *filename,string *method_name,FILE **file,HighsFileType *file_type)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  HighsStatus HVar4;
  HighsStatus HVar5;
  
  *file_type = kFull;
  iVar1 = std::__cxx11::string::compare((char *)filename);
  if (iVar1 == 0) {
    *file = _stdout;
    HVar5 = kOk;
  }
  else {
    pFVar2 = fopen((filename->_M_dataplus)._M_p,"w");
    *file = (FILE *)pFVar2;
    if (pFVar2 == (FILE *)0x0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Cannot open writable file \"%s\" in %s\n",(filename->_M_dataplus)._M_p,
                   (method_name->_M_dataplus)._M_p);
      HVar5 = kError;
    }
    else {
      pcVar3 = strrchr((filename->_M_dataplus)._M_p,0x2e);
      HVar4 = kOk;
      HVar5 = kOk;
      if (pcVar3 != (char *)0x0) {
        iVar1 = std::__cxx11::string::compare((char *)filename);
        HVar5 = HVar4;
        if (iVar1 != 0) {
          pcVar3 = pcVar3 + 1;
          iVar1 = strcmp(pcVar3,"mps");
          if (iVar1 == 0) {
            *file_type = kMps;
          }
          else {
            iVar1 = strcmp(pcVar3,"lp");
            if (iVar1 == 0) {
              *file_type = kLp;
            }
            else {
              iVar1 = strcmp(pcVar3,"md");
              if (iVar1 == 0) {
                *file_type = kMd;
              }
            }
          }
        }
      }
    }
  }
  return HVar5;
}

Assistant:

HighsStatus Highs::openWriteFile(const string filename,
                                 const string method_name, FILE*& file,
                                 HighsFileType& file_type) const {
  file_type = HighsFileType::kFull;
  if (filename == "") {
    // Empty file name: use stdout
    file = stdout;
  } else {
    file = fopen(filename.c_str(), "w");
    if (file == 0) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Cannot open writable file \"%s\" in %s\n", filename.c_str(),
                   method_name.c_str());
      return HighsStatus::kError;
    }
    const char* dot = strrchr(filename.c_str(), '.');
    if (dot && dot != filename) {
      if (strcmp(dot + 1, "mps") == 0) {
        file_type = HighsFileType::kMps;
      } else if (strcmp(dot + 1, "lp") == 0) {
        file_type = HighsFileType::kLp;
      } else if (strcmp(dot + 1, "md") == 0) {
        file_type = HighsFileType::kMd;
      }
    }
  }
  return HighsStatus::kOk;
}